

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall mkvparser::Segment::Load(Segment *this)

{
  long lVar1;
  longlong lVar2;
  bool bVar3;
  long size;
  longlong pos;
  long local_40;
  longlong local_38;
  
  lVar2 = -1;
  if (((this->m_clusters == (Cluster **)0x0) && (this->m_clusterSize == 0)) &&
     (this->m_clusterCount == 0)) {
    lVar2 = ParseHeaders(this);
    bVar3 = lVar2 == 0;
    if (((-1 < lVar2) && (lVar2 = -3, bVar3)) &&
       ((lVar2 = -2, this->m_pInfo != (SegmentInfo *)0x0 && (this->m_pTracks != (Tracks *)0x0)))) {
      do {
        do {
          lVar1 = DoLoadCluster(this,&local_38,&local_40);
        } while (1 < lVar1);
        if (lVar1 != 0) {
          lVar2 = 0;
        }
        if (lVar1 < 0) {
          lVar2 = lVar1;
        }
      } while (lVar1 == 0);
    }
  }
  return lVar2;
}

Assistant:

long Segment::Load() {
  if (m_clusters != NULL || m_clusterSize != 0 || m_clusterCount != 0)
    return E_PARSE_FAILED;

  // Outermost (level 0) segment object has been constructed,
  // and pos designates start of payload.  We need to find the
  // inner (level 1) elements.

  const long long header_status = ParseHeaders();

  if (header_status < 0)  // error
    return static_cast<long>(header_status);

  if (header_status > 0)  // underflow
    return E_BUFFER_NOT_FULL;

  if (m_pInfo == NULL || m_pTracks == NULL)
    return E_FILE_FORMAT_INVALID;

  for (;;) {
    const long status = LoadCluster();

    if (status < 0)  // error
      return status;

    if (status >= 1)  // no more clusters
      return 0;
  }
}